

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run_trotter.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  double dVar1;
  double dVar2;
  pointer pcVar3;
  pointer pcVar4;
  int *piVar5;
  long lVar6;
  ostream *poVar7;
  long lVar8;
  undefined8 uVar9;
  char *__function;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  int iVar14;
  bool bVar15;
  double t_cpu;
  double t_gpu;
  vector<int,_std::allocator<int>_> qubits;
  QCircuit<std::complex<float>,_qclab::QObject<std::complex<float>_>_> circuit;
  vector<double,_std::allocator<double>_> T_gpu;
  vector<double,_std::allocator<double>_> T_cpu;
  uint local_13c;
  double local_138;
  allocator_type local_129;
  long local_128;
  double local_120;
  int *local_118;
  iterator iStack_110;
  int *local_108;
  pointer local_f8;
  pointer pcStack_f0;
  pointer local_e8;
  undefined1 local_d8 [24];
  vector<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>_>_>
  local_c0;
  void *local_a8;
  iterator iStack_a0;
  double *local_98;
  void *local_88;
  iterator iStack_80;
  double *local_78;
  long local_70;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> local_68;
  int local_50;
  int local_4c;
  value_type local_48;
  
  bVar15 = true;
  uVar12 = 10;
  if (argc < 2) {
    local_4c = 100;
LAB_0010590c:
    local_70 = 0x14;
  }
  else {
    local_4c = (int)*argv[1];
    if (argc == 2) goto LAB_0010590c;
    local_70 = 0x14;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_d8,argv[2],(allocator<char> *)&local_68);
    uVar9 = local_d8._0_8_;
    piVar5 = __errno_location();
    local_128 = CONCAT44(local_128._4_4_,*piVar5);
    *piVar5 = 0;
    uVar12 = strtol((char *)uVar9,(char **)&local_f8,10);
    if (local_f8 == (pointer)uVar9) {
      std::__throw_invalid_argument("stoi");
LAB_0010648b:
      std::__throw_out_of_range("stoi");
LAB_00106497:
      std::__throw_invalid_argument("stoi");
LAB_001064a3:
      std::__throw_out_of_range("stoi");
LAB_001064af:
      std::__throw_invalid_argument("stoi");
LAB_001064bb:
      std::__throw_out_of_range("stoi");
LAB_001064c7:
      std::__throw_invalid_argument("stoi");
LAB_001064d3:
      uVar9 = std::__throw_out_of_range("stoi");
      _Unwind_Resume(uVar9);
    }
    if (((long)(int)uVar12 != uVar12) || (*piVar5 == 0x22)) goto LAB_0010648b;
    if (*piVar5 == 0) {
      *piVar5 = (int)local_128;
    }
    if ((pointer)local_d8._0_8_ != (pointer)(local_d8 + 0x10)) {
      operator_delete((void *)local_d8._0_8_,CONCAT44(local_d8._20_4_,local_d8._16_4_) + 1);
    }
    if (3 < (uint)argc) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_d8,argv[3],(allocator<char> *)&local_68);
      uVar9 = local_d8._0_8_;
      local_128 = CONCAT44(local_128._4_4_,*piVar5);
      *piVar5 = 0;
      lVar6 = strtol((char *)local_d8._0_8_,(char **)&local_f8,10);
      if (local_f8 == (pointer)uVar9) goto LAB_00106497;
      local_70 = lVar6;
      if ((lVar6 - 0x80000000U < 0xffffffff00000000) || (*piVar5 == 0x22)) goto LAB_001064a3;
      if (*piVar5 == 0) {
        *piVar5 = (int)local_128;
      }
      if ((pointer)local_d8._0_8_ != (pointer)(local_d8 + 0x10)) {
        operator_delete((void *)local_d8._0_8_,CONCAT44(local_d8._20_4_,local_d8._16_4_) + 1);
      }
      if (argc == 4) goto LAB_00105919;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_d8,argv[4],(allocator<char> *)&local_68);
      uVar9 = local_d8._0_8_;
      local_50 = *piVar5;
      *piVar5 = 0;
      lVar6 = strtol((char *)local_d8._0_8_,(char **)&local_f8,10);
      if (local_f8 == (pointer)uVar9) goto LAB_001064af;
      local_128 = lVar6;
      if ((lVar6 - 0x80000000U < 0xffffffff00000000) || (*piVar5 == 0x22)) goto LAB_001064bb;
      if (*piVar5 == 0) {
        *piVar5 = local_50;
      }
      if ((pointer)local_d8._0_8_ != (pointer)(local_d8 + 0x10)) {
        operator_delete((void *)local_d8._0_8_,CONCAT44(local_d8._20_4_,local_d8._16_4_) + 1);
      }
      lVar6 = local_128;
      if ((uint)argc < 6) goto LAB_0010591f;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_d8,argv[5],(allocator<char> *)&local_68);
      uVar9 = local_d8._0_8_;
      iVar14 = *piVar5;
      *piVar5 = 0;
      lVar6 = strtol((char *)local_d8._0_8_,(char **)&local_f8,10);
      if (local_f8 != (pointer)uVar9) {
        if ((0xfffffffeffffffff < lVar6 - 0x80000000U) && (*piVar5 != 0x22)) {
          if (*piVar5 == 0) {
            *piVar5 = iVar14;
          }
          if ((pointer)local_d8._0_8_ != (pointer)(local_d8 + 0x10)) {
            operator_delete((void *)local_d8._0_8_,CONCAT44(local_d8._20_4_,local_d8._16_4_) + 1);
          }
          bVar15 = ((uint)lVar6 & 0xfffffffd) == 1;
          lVar6 = local_128;
          goto LAB_0010591f;
        }
        goto LAB_001064d3;
      }
      goto LAB_001064c7;
    }
  }
LAB_00105919:
  lVar6 = 2;
LAB_0010591f:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"nb qubits = ",0xc);
  uVar10 = (uint)uVar12;
  poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,uVar10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,":",1);
  poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,(int)lVar6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,":",1);
  lVar8 = local_70;
  iVar14 = (int)local_70;
  std::ostream::operator<<((ostream *)poVar7,iVar14);
  local_13c = uVar10;
  local_128 = lVar6;
  if (local_4c == 100) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,", T = std::complex<double>",0x1a);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
    std::ostream::put('\b');
    std::ostream::flush();
    local_108 = (int *)0x0;
    local_118 = (int *)0x0;
    iStack_110._M_current = (int *)0x0;
    local_78 = (double *)0x0;
    local_88 = (void *)0x0;
    iStack_80._M_current = (double *)0x0;
    local_98 = (double *)0x0;
    local_a8 = (void *)0x0;
    iStack_a0._M_current = (double *)0x0;
    if ((int)uVar10 <= iVar14) {
      do {
        local_d8[8] = false;
        local_d8._0_8_ = &PTR_nbQubits_00122278;
        uVar10 = (uint)uVar12;
        local_d8._16_4_ = 0;
        local_c0.
        super__Vector_base<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_c0.
        super__Vector_base<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_c0.
        super__Vector_base<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_d8._12_4_ = uVar10;
        if ((int)uVar10 < 1) {
          __function = 
          "qclab::QCircuit<std::complex<double>>::QCircuit(const int) [T = std::complex<double>, G = qclab::QObject<std::complex<double>>]"
          ;
          goto LAB_00106475;
        }
        trotter<std::complex<double>>
                  ((QCircuit<std::complex<double>,_qclab::QObject<std::complex<double>_>_> *)
                   local_d8);
        local_138 = 9999.0;
        local_120 = 9999.0;
        local_f8 = (pointer)0x0;
        pcStack_f0 = (pointer)0x0;
        local_e8 = (pointer)0x0;
        if (bVar15) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"CPU(",4);
          poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,uVar10);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,")",1);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
          std::ostream::put((char)poVar7);
          std::ostream::flush();
          uVar13 = 3;
          uVar10 = 0;
          do {
            local_48._M_value._0_8_ = 0;
            local_48._M_value._8_8_ = 0;
            std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
                      (&local_68,1L << ((byte)uVar12 & 0x3f),&local_48,(allocator_type *)&local_129)
            ;
            pcVar4 = local_e8;
            pcVar3 = local_f8;
            local_f8 = local_68.
                       super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            pcStack_f0 = local_68.
                         super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
            local_e8 = local_68.
                       super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
            local_68.
            super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl
            .super__Vector_impl_data._M_start = (pointer)0x0;
            local_68.
            super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl
            .super__Vector_impl_data._M_finish = (pointer)0x0;
            local_68.
            super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl
            .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            if ((pcVar3 != (pointer)0x0) &&
               (operator_delete(pcVar3,(long)pcVar4 - (long)pcVar3),
               local_68.
               super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
               _M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
              operator_delete(local_68.
                              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)local_68.
                                    super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_68.
                                    super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            *(undefined **)local_f8->_M_value = (undefined *)0x3ff0000000000000;
            *(undefined **)((long)local_f8->_M_value + 8) = (undefined *)0x0;
            lVar6 = std::chrono::_V2::system_clock::now();
            (**(_func_int **)(local_d8._0_8_ + 0x40))
                      ((QCircuit<std::complex<double>,_qclab::QObject<std::complex<double>_>_> *)
                       local_d8,0x4e,(ulong)(uint)local_d8._12_4_,&local_f8,0);
            lVar8 = std::chrono::_V2::system_clock::now();
            dVar2 = (double)(lVar8 - lVar6) / 1000000000.0;
            if (dVar2 < local_138) {
              local_138 = dVar2;
            }
            uVar11 = uVar10 + 1;
            if (uVar10 == 2) {
              uVar10 = 100;
              if ((local_138 < 0.1) || (uVar10 = 10, local_138 < 1.0)) {
                printf("  * it%4i:%12.6fs",3);
                uVar13 = uVar10;
              }
              else {
                printf("  * it%4i:%12.6fs",3);
                if (uVar13 == 3) break;
              }
LAB_001061b9:
              std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
              std::ostream::put('\b');
              std::ostream::flush();
            }
            else if ((uVar10 < 3 || uVar11 == uVar13) &&
                    (printf("  * it%4i:%12.6fs",(ulong)uVar11), uVar11 != uVar13))
            goto LAB_001061b9;
            uVar10 = uVar11;
          } while ((int)uVar11 < (int)uVar13);
          printf("  -->  min t_cpu = %.6fs\n",SUB84(local_138,0));
          lVar8 = local_70;
          if ((local_138 == 9999.0) && (!NAN(local_138))) goto LAB_0010621a;
        }
        else {
LAB_0010621a:
          local_138 = 0.0;
        }
        if ((local_120 == 9999.0) && (!NAN(local_120))) {
          local_120 = 0.0;
        }
        if (local_f8 != (pointer)0x0) {
          operator_delete(local_f8,(long)local_e8 - (long)local_f8);
        }
        local_d8._0_8_ = &PTR_nbQubits_00122278;
        std::
        vector<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>_>_>
        ::~vector(&local_c0);
        if (iStack_110._M_current == local_108) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&local_118,iStack_110,(int *)&local_13c);
        }
        else {
          *iStack_110._M_current = local_13c;
          iStack_110._M_current = iStack_110._M_current + 1;
        }
        if (iStack_80._M_current == local_78) {
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    ((vector<double,std::allocator<double>> *)&local_88,iStack_80,&local_138);
        }
        else {
          *iStack_80._M_current = local_138;
          iStack_80._M_current = iStack_80._M_current + 1;
        }
        if (iStack_a0._M_current == local_98) {
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    ((vector<double,std::allocator<double>> *)&local_a8,iStack_a0,&local_120);
        }
        else {
          *iStack_a0._M_current = local_120;
          iStack_a0._M_current = iStack_a0._M_current + 1;
        }
        local_13c = local_13c + (int)local_128;
        uVar12 = (ulong)local_13c;
      } while ((int)local_13c <= (int)lVar8);
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
    std::ostream::put('\b');
    std::ostream::flush();
    if (iStack_110._M_current != local_118) {
      uVar12 = 0;
      do {
        dVar2 = *(double *)((long)local_88 + uVar12 * 8);
        dVar1 = *(double *)((long)local_a8 + uVar12 * 8);
        printf("  %2i | %12.6fs | %12.6fs | %6.2fx\n",SUB84(dVar2,0),dVar1,dVar2 / dVar1,
               (ulong)(uint)local_118[uVar12]);
        uVar12 = uVar12 + 1;
      } while (uVar12 < (ulong)((long)iStack_110._M_current - (long)local_118 >> 2));
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
    std::ostream::put('\b');
    std::ostream::flush();
  }
  else {
    if (local_4c != 0x73) {
      return -100;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,", T = std::complex<float>",0x19);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
    std::ostream::put('\b');
    std::ostream::flush();
    local_108 = (int *)0x0;
    local_118 = (int *)0x0;
    iStack_110._M_current = (int *)0x0;
    local_78 = (double *)0x0;
    local_88 = (void *)0x0;
    iStack_80._M_current = (double *)0x0;
    local_98 = (double *)0x0;
    local_a8 = (void *)0x0;
    iStack_a0._M_current = (double *)0x0;
    if ((int)uVar10 <= iVar14) {
      do {
        local_d8[8] = false;
        local_d8._0_8_ = &PTR_nbQubits_00121cd0;
        uVar10 = (uint)uVar12;
        local_d8._16_4_ = 0;
        local_c0.
        super__Vector_base<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_c0.
        super__Vector_base<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_c0.
        super__Vector_base<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_d8._12_4_ = uVar10;
        if ((int)uVar10 < 1) {
          __function = 
          "qclab::QCircuit<std::complex<float>>::QCircuit(const int) [T = std::complex<float>, G = qclab::QObject<std::complex<float>>]"
          ;
LAB_00106475:
          local_c0.
          super__Vector_base<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_c0.
          super__Vector_base<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_c0.
          super__Vector_base<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_d8._16_4_ = 0;
          local_d8[8] = false;
          __assert_fail("nbQubits > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O3/_deps/qclabpp-src/include/qclab/QCircuit.hpp"
                        ,0x34,__function);
        }
        trotter<std::complex<float>>
                  ((QCircuit<std::complex<float>,_qclab::QObject<std::complex<float>_>_> *)local_d8)
        ;
        local_138 = 9999.0;
        local_120 = 9999.0;
        local_f8 = (pointer)0x0;
        pcStack_f0 = (pointer)0x0;
        local_e8 = (pointer)0x0;
        if (bVar15) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"CPU(",4);
          poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,uVar10);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,")",1);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
          std::ostream::put((char)poVar7);
          std::ostream::flush();
          uVar13 = 3;
          uVar10 = 0;
          do {
            local_48._M_value._0_8_ = 0;
            std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::vector
                      ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
                       &local_68,1L << ((byte)uVar12 & 0x3f),(value_type *)&local_48,&local_129);
            pcVar4 = local_e8;
            pcVar3 = local_f8;
            local_f8 = local_68.
                       super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            pcStack_f0 = local_68.
                         super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
            local_e8 = local_68.
                       super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
            local_68.
            super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl
            .super__Vector_impl_data._M_start = (pointer)0x0;
            local_68.
            super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl
            .super__Vector_impl_data._M_finish = (pointer)0x0;
            local_68.
            super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl
            .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            if ((pcVar3 != (pointer)0x0) &&
               (operator_delete(pcVar3,(long)pcVar4 - (long)pcVar3),
               local_68.
               super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
               _M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
              operator_delete(local_68.
                              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)local_68.
                                    super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_68.
                                    super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            *(undefined **)local_f8->_M_value = (undefined *)0x3f800000;
            lVar6 = std::chrono::_V2::system_clock::now();
            (**(_func_int **)(local_d8._0_8_ + 0x40))
                      ((QCircuit<std::complex<float>,_qclab::QObject<std::complex<float>_>_> *)
                       local_d8,0x4e,(ulong)(uint)local_d8._12_4_,&local_f8,0);
            lVar8 = std::chrono::_V2::system_clock::now();
            dVar2 = (double)(lVar8 - lVar6) / 1000000000.0;
            if (dVar2 < local_138) {
              local_138 = dVar2;
            }
            uVar11 = uVar10 + 1;
            if (uVar10 == 2) {
              uVar10 = 100;
              if ((local_138 < 0.1) || (uVar10 = 10, local_138 < 1.0)) {
                printf("  * it%4i:%12.6fs",3);
                uVar13 = uVar10;
              }
              else {
                printf("  * it%4i:%12.6fs",3);
                if (uVar13 == 3) break;
              }
LAB_00105c9b:
              std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
              std::ostream::put('\b');
              std::ostream::flush();
            }
            else if ((uVar10 < 3 || uVar11 == uVar13) &&
                    (printf("  * it%4i:%12.6fs",(ulong)uVar11), uVar11 != uVar13))
            goto LAB_00105c9b;
            uVar10 = uVar11;
          } while ((int)uVar11 < (int)uVar13);
          printf("  -->  min t_cpu = %.6fs\n",SUB84(local_138,0));
          lVar8 = local_70;
          if ((local_138 == 9999.0) && (!NAN(local_138))) goto LAB_00105cfc;
        }
        else {
LAB_00105cfc:
          local_138 = 0.0;
        }
        if ((local_120 == 9999.0) && (!NAN(local_120))) {
          local_120 = 0.0;
        }
        if (local_f8 != (pointer)0x0) {
          operator_delete(local_f8,(long)local_e8 - (long)local_f8);
        }
        local_d8._0_8_ = &PTR_nbQubits_00121cd0;
        std::
        vector<std::unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>_>_>
        ::~vector((vector<std::unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>_>_>
                   *)&local_c0);
        if (iStack_110._M_current == local_108) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&local_118,iStack_110,(int *)&local_13c);
        }
        else {
          *iStack_110._M_current = local_13c;
          iStack_110._M_current = iStack_110._M_current + 1;
        }
        if (iStack_80._M_current == local_78) {
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    ((vector<double,std::allocator<double>> *)&local_88,iStack_80,&local_138);
        }
        else {
          *iStack_80._M_current = local_138;
          iStack_80._M_current = iStack_80._M_current + 1;
        }
        if (iStack_a0._M_current == local_98) {
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    ((vector<double,std::allocator<double>> *)&local_a8,iStack_a0,&local_120);
        }
        else {
          *iStack_a0._M_current = local_120;
          iStack_a0._M_current = iStack_a0._M_current + 1;
        }
        local_13c = local_13c + (int)local_128;
        uVar12 = (ulong)local_13c;
      } while ((int)local_13c <= (int)lVar8);
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
    std::ostream::put('\b');
    std::ostream::flush();
    if (iStack_110._M_current != local_118) {
      uVar12 = 0;
      do {
        dVar2 = *(double *)((long)local_88 + uVar12 * 8);
        dVar1 = *(double *)((long)local_a8 + uVar12 * 8);
        printf("  %2i | %12.6fs | %12.6fs | %6.2fx\n",SUB84(dVar2,0),dVar1,dVar2 / dVar1,
               (ulong)(uint)local_118[uVar12]);
        uVar12 = uVar12 + 1;
      } while (uVar12 < (ulong)((long)iStack_110._M_current - (long)local_118 >> 2));
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
    std::ostream::put('\b');
    std::ostream::flush();
  }
  if (local_a8 != (void *)0x0) {
    operator_delete(local_a8,(long)local_98 - (long)local_a8);
  }
  if (local_88 != (void *)0x0) {
    operator_delete(local_88,(long)local_78 - (long)local_88);
  }
  if (local_118 != (int *)0x0) {
    operator_delete(local_118,(long)local_108 - (long)local_118);
  }
  return 0;
}

Assistant:

int main( int argc , char *argv[] ) {

  // defaults
  char type = 'd' ;
  int  qmin = 10 ;
  int  qmax = 20 ;
  int  qstp = 2 ;
  int  test = 3 ;

  // arguments
  if ( argc > 1 ) type = argv[1][0] ;
  if ( argc > 2 ) qmin = std::stoi( argv[2] ) ;
  if ( argc > 3 ) qmax = std::stoi( argv[3] ) ;
  if ( argc > 4 ) qstp = std::stoi( argv[4] ) ;
  if ( argc > 5 ) test = std::stoi( argv[5] ) ;
  std::cout << "nb qubits = " << qmin << ":" << qstp << ":" << qmax ;

  int r = 0 ;
  if ( type == 's' ) {
    // float
    std::cout << ", T = std::complex<float>" << std::endl ;
    using T = std::complex< float > ;
    auto f = [&] ( qclab::QCircuit< T >& circuit ) { trotter( circuit ) ; } ;
    r = timings< T >( qmin , qmax , qstp , test , f ) ;
  } else if ( type == 'd' ) {
    // double
    using T = std::complex< double > ;
    auto f = [&] ( qclab::QCircuit< T >& circuit ) { trotter( circuit ) ; } ;
    std::cout << ", T = std::complex<double>" << std::endl ;
    r = timings< T >( qmin , qmax , qstp , test , f ) ;
  } else {
    r = -100 ;
  }
  return r ;

}